

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::scan
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  char *pcVar1;
  bool bVar2;
  pointer pCVar3;
  char *pcVar4;
  
  std::
  vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ::resize(&this->props_,
           (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  pCVar3 = (this->props_).
           super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar4 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start; pcVar4 != pcVar1; pcVar4 = pcVar4 + 1) {
    pCVar3->uppercase = (byte)(*pcVar4 + 0xbfU) < 0x1a;
    pCVar3 = pCVar3 + 1;
  }
  if (this->case_sensitive_ != false) {
    bVar2 = scan_match<true>(this);
    return bVar2;
  }
  bVar2 = scan_match<false>(this);
  return bVar2;
}

Assistant:

bool scan() {
    props_.resize(item_.size());
    auto props_it = props_.begin();
    for (auto item_it = item_.cbegin(), item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->uppercase = StringTraits::is_uppercase(*item_it);
    }
    if (case_sensitive_) {
      return scan_match<true>();
    } else {
      return scan_match<false>();
    }
  }